

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O1

bool ImGui_ImplSDL2_ProcessEvent(SDL_Event *event)

{
  float fVar1;
  float wheel_y;
  char cVar2;
  Uint8 UVar3;
  ushort uVar4;
  Uint32 UVar5;
  int iVar6;
  int iVar7;
  ImGuiContext *pIVar8;
  ImGuiIO *pIVar9;
  ImGuiIO *this;
  uint uVar10;
  uint uVar11;
  ImGuiKey key;
  void *pvVar12;
  
  pIVar8 = ImGui::GetCurrentContext();
  if (pIVar8 == (ImGuiContext *)0x0) {
    pvVar12 = (void *)0x0;
  }
  else {
    pIVar9 = ImGui::GetIO();
    pvVar12 = pIVar9->BackendPlatformUserData;
  }
  pIVar9 = ImGui::GetIO();
  UVar5 = event->type;
  if (0x400 < (int)UVar5) {
    if (UVar5 - 0x401 < 2) {
      cVar2 = (event->edit).text[4];
      uVar11 = 1;
      if (cVar2 != '\x03') {
        uVar11 = -(uint)(cVar2 != '\x01');
      }
      uVar10 = 2;
      if (cVar2 != '\x02') {
        uVar10 = uVar11;
      }
      uVar11 = 3;
      if (cVar2 != '\x04') {
        uVar11 = uVar10;
      }
      uVar10 = 4;
      if (cVar2 != '\x05') {
        uVar10 = uVar11;
      }
      if (uVar10 != 0xffffffff) {
        ImGuiIO::AddMouseSourceEvent(pIVar9,(uint)((event->motion).which == 0xffffffff));
        ImGuiIO::AddMouseButtonEvent(pIVar9,uVar10,event->type == 0x401);
        uVar11 = *(uint *)((long)pvVar12 + 0x24) & ~(1 << (uVar10 & 0x1f));
        if (event->type == 0x401) {
          uVar11 = *(uint *)((long)pvVar12 + 0x24) | 1 << (uVar10 & 0x1f);
        }
        *(uint *)((long)pvVar12 + 0x24) = uVar11;
        return true;
      }
      return false;
    }
    if (UVar5 - 0x653 < 2) {
      *(undefined1 *)((long)pvVar12 + 0x94) = 1;
      return true;
    }
    if (UVar5 == 0x403) {
      fVar1 = (float)(event->key).keysym.unused;
      wheel_y = (event->wheel).preciseY;
      ImGuiIO::AddMouseSourceEvent(pIVar9,(uint)((event->motion).which == 0xffffffff));
      ImGuiIO::AddMouseWheelEvent(pIVar9,-fVar1,wheel_y);
      return true;
    }
    return false;
  }
  if (0x302 < (int)UVar5) {
    if (UVar5 == 0x303) {
      ImGuiIO::AddInputCharactersUTF8(pIVar9,(event->edit).text);
      return true;
    }
    if (UVar5 == 0x400) {
      iVar7 = (event->window).data2;
      iVar6 = (event->motion).y;
      ImGuiIO::AddMouseSourceEvent(pIVar9,(uint)((event->motion).which == 0xffffffff));
      ImGuiIO::AddMousePosEvent(pIVar9,(float)iVar7,(float)iVar6);
      return true;
    }
    return false;
  }
  if (1 < UVar5 - 0x300) {
    if (UVar5 != 0x200) {
      return false;
    }
    UVar3 = (event->display).event;
    if (UVar3 == '\f') {
      ImGuiIO::AddFocusEvent(pIVar9,true);
      return true;
    }
    if (UVar3 == '\v') {
      iVar7 = ImGui::GetFrameCount();
      iVar7 = iVar7 + 1;
    }
    else {
      if (UVar3 != '\n') goto LAB_001db92c;
      *(Uint32 *)((long)pvVar12 + 0x20) = (event->display).display;
      iVar7 = 0;
    }
    *(int *)((long)pvVar12 + 0x78) = iVar7;
LAB_001db92c:
    if ((event->display).event == '\r') {
      ImGuiIO::AddFocusEvent(pIVar9,false);
      return true;
    }
    return true;
  }
  uVar4 = (event->key).keysym.mod;
  this = ImGui::GetIO();
  ImGuiIO::AddKeyEvent(this,ImGuiKey_ModCtrl,(uVar4 & 0xc0) != 0);
  ImGuiIO::AddKeyEvent(this,ImGuiKey_ModShift,(uVar4 & 3) != 0);
  ImGuiIO::AddKeyEvent(this,ImGuiKey_ModAlt,(uVar4 & 0x300) != 0);
  ImGuiIO::AddKeyEvent(this,ImGuiKey_ModSuper,(uVar4 & 0xc00) != 0);
  iVar7 = (event->window).data2;
  if (0x400000df < iVar7) {
    switch(iVar7) {
    case 0x400000e0:
      key = ImGuiKey_LeftCtrl;
      break;
    case 0x400000e1:
      key = ImGuiKey_LeftShift;
      break;
    case 0x400000e2:
      key = ImGuiKey_LeftAlt;
      break;
    case 0x400000e3:
      key = ImGuiKey_LeftSuper;
      break;
    case 0x400000e4:
      key = ImGuiKey_RightCtrl;
      break;
    case 0x400000e5:
      key = ImGuiKey_RightShift;
      break;
    case 0x400000e6:
      key = ImGuiKey_RightAlt;
      break;
    case 0x400000e7:
      key = ImGuiKey_RightSuper;
      break;
    default:
      if (iVar7 == 0x4000010e) {
        key = ImGuiKey_AppBack;
        break;
      }
      if (iVar7 == 0x4000010f) {
        key = ImGuiKey_AppForward;
        break;
      }
      goto switchD_001db8d3_caseD_4000004c;
    }
    goto LAB_001db98e;
  }
  switch(iVar7) {
  case 0x40000039:
    key = ImGuiKey_CapsLock;
    break;
  case 0x4000003a:
    key = ImGuiKey_F1;
    break;
  case 0x4000003b:
    key = ImGuiKey_F2;
    break;
  case 0x4000003c:
    key = ImGuiKey_F3;
    break;
  case 0x4000003d:
    key = ImGuiKey_F4;
    break;
  case 0x4000003e:
    key = ImGuiKey_F5;
    break;
  case 0x4000003f:
    key = ImGuiKey_F6;
    break;
  case 0x40000040:
    key = ImGuiKey_F7;
    break;
  case 0x40000041:
    key = ImGuiKey_F8;
    break;
  case 0x40000042:
    key = ImGuiKey_F9;
    break;
  case 0x40000043:
    key = ImGuiKey_F10;
    break;
  case 0x40000044:
    key = ImGuiKey_F11;
    break;
  case 0x40000045:
    key = ImGuiKey_F12;
    break;
  case 0x40000046:
    key = ImGuiKey_PrintScreen;
    break;
  case 0x40000047:
    key = ImGuiKey_ScrollLock;
    break;
  case 0x40000048:
    key = ImGuiKey_Pause;
    break;
  case 0x40000049:
    key = ImGuiKey_Insert;
    break;
  case 0x4000004a:
    key = ImGuiKey_Home;
    break;
  case 0x4000004b:
    key = ImGuiKey_PageUp;
    break;
  case 0x4000004c:
  case 0x40000064:
  case 0x40000066:
switchD_001db8d3_caseD_4000004c:
    key = ImGuiKey_KeysData_OFFSET;
    break;
  case 0x4000004d:
    key = ImGuiKey_End;
    break;
  case 0x4000004e:
    key = ImGuiKey_PageDown;
    break;
  case 0x4000004f:
    key = ImGuiKey_RightArrow;
    break;
  case 0x40000050:
    key = ImGuiKey_LeftArrow;
    break;
  case 0x40000051:
    key = ImGuiKey_DownArrow;
    break;
  case 0x40000052:
    key = ImGuiKey_UpArrow;
    break;
  case 0x40000053:
    key = ImGuiKey_NumLock;
    break;
  case 0x40000054:
    key = ImGuiKey_KeypadDivide;
    break;
  case 0x40000055:
    key = ImGuiKey_KeypadMultiply;
    break;
  case 0x40000056:
    key = ImGuiKey_KeypadSubtract;
    break;
  case 0x40000057:
    key = ImGuiKey_KeypadAdd;
    break;
  case 0x40000058:
    key = ImGuiKey_KeypadEnter;
    break;
  case 0x40000059:
    key = ImGuiKey_Keypad1;
    break;
  case 0x4000005a:
    key = ImGuiKey_Keypad2;
    break;
  case 0x4000005b:
    key = ImGuiKey_Keypad3;
    break;
  case 0x4000005c:
    key = ImGuiKey_Keypad4;
    break;
  case 0x4000005d:
    key = ImGuiKey_Keypad5;
    break;
  case 0x4000005e:
    key = ImGuiKey_Keypad6;
    break;
  case 0x4000005f:
    key = ImGuiKey_Keypad7;
    break;
  case 0x40000060:
    key = ImGuiKey_Keypad8;
    break;
  case 0x40000061:
    key = ImGuiKey_Keypad9;
    break;
  case 0x40000062:
    key = ImGuiKey_Keypad0;
    break;
  case 0x40000063:
    key = ImGuiKey_KeypadDecimal;
    break;
  case 0x40000065:
    key = ImGuiKey_Menu;
    break;
  case 0x40000067:
    key = ImGuiKey_KeypadEqual;
    break;
  case 0x40000068:
    key = ImGuiKey_F13;
    break;
  case 0x40000069:
    key = ImGuiKey_F14;
    break;
  case 0x4000006a:
    key = ImGuiKey_F15;
    break;
  case 0x4000006b:
    key = ImGuiKey_F16;
    break;
  case 0x4000006c:
    key = ImGuiKey_F17;
    break;
  case 0x4000006d:
    key = ImGuiKey_F18;
    break;
  case 0x4000006e:
    key = ImGuiKey_F19;
    break;
  case 0x4000006f:
    key = ImGuiKey_F20;
    break;
  case 0x40000070:
    key = ImGuiKey_F21;
    break;
  case 0x40000071:
    key = ImGuiKey_F22;
    break;
  case 0x40000072:
    key = ImGuiKey_F23;
    break;
  case 0x40000073:
    key = ImGuiKey_F24;
    break;
  default:
    switch(iVar7) {
    case 8:
      key = ImGuiKey_Backspace;
      break;
    case 9:
      key = ImGuiKey_NamedKey_BEGIN;
      break;
    default:
      goto switchD_001db8d3_caseD_4000004c;
    case 0xd:
      key = ImGuiKey_Enter;
      break;
    case 0x1b:
      key = ImGuiKey_Escape;
      break;
    case 0x20:
      key = ImGuiKey_Space;
      break;
    case 0x27:
      key = ImGuiKey_Apostrophe;
      break;
    case 0x2c:
      key = ImGuiKey_Comma;
      break;
    case 0x2d:
      key = ImGuiKey_Minus;
      break;
    case 0x2e:
      key = ImGuiKey_Period;
      break;
    case 0x2f:
      key = ImGuiKey_Slash;
      break;
    case 0x30:
      key = ImGuiKey_0;
      break;
    case 0x31:
      key = ImGuiKey_1;
      break;
    case 0x32:
      key = ImGuiKey_2;
      break;
    case 0x33:
      key = ImGuiKey_3;
      break;
    case 0x34:
      key = ImGuiKey_4;
      break;
    case 0x35:
      key = ImGuiKey_5;
      break;
    case 0x36:
      key = ImGuiKey_6;
      break;
    case 0x37:
      key = ImGuiKey_7;
      break;
    case 0x38:
      key = ImGuiKey_8;
      break;
    case 0x39:
      key = ImGuiKey_9;
      break;
    case 0x3b:
      key = ImGuiKey_Semicolon;
      break;
    case 0x3d:
      key = ImGuiKey_Equal;
      break;
    case 0x5b:
      key = ImGuiKey_LeftBracket;
      break;
    case 0x5c:
      key = ImGuiKey_Backslash;
      break;
    case 0x5d:
      key = ImGuiKey_RightBracket;
      break;
    case 0x60:
      key = ImGuiKey_GraveAccent;
      break;
    case 0x61:
      key = ImGuiKey_A;
      break;
    case 0x62:
      key = ImGuiKey_B;
      break;
    case 99:
      key = ImGuiKey_C;
      break;
    case 100:
      key = ImGuiKey_D;
      break;
    case 0x65:
      key = ImGuiKey_E;
      break;
    case 0x66:
      key = ImGuiKey_F;
      break;
    case 0x67:
      key = ImGuiKey_G;
      break;
    case 0x68:
      key = ImGuiKey_H;
      break;
    case 0x69:
      key = ImGuiKey_I;
      break;
    case 0x6a:
      key = ImGuiKey_J;
      break;
    case 0x6b:
      key = ImGuiKey_K;
      break;
    case 0x6c:
      key = ImGuiKey_L;
      break;
    case 0x6d:
      key = ImGuiKey_M;
      break;
    case 0x6e:
      key = ImGuiKey_N;
      break;
    case 0x6f:
      key = ImGuiKey_O;
      break;
    case 0x70:
      key = ImGuiKey_P;
      break;
    case 0x71:
      key = ImGuiKey_Q;
      break;
    case 0x72:
      key = ImGuiKey_R;
      break;
    case 0x73:
      key = ImGuiKey_S;
      break;
    case 0x74:
      key = ImGuiKey_T;
      break;
    case 0x75:
      key = ImGuiKey_U;
      break;
    case 0x76:
      key = ImGuiKey_V;
      break;
    case 0x77:
      key = ImGuiKey_W;
      break;
    case 0x78:
      key = ImGuiKey_X;
      break;
    case 0x79:
      key = ImGuiKey_Y;
      break;
    case 0x7a:
      key = ImGuiKey_Z;
      break;
    case 0x7f:
      key = ImGuiKey_Delete;
    }
  }
LAB_001db98e:
  ImGuiIO::AddKeyEvent(pIVar9,key,event->type == 0x300);
  ImGuiIO::SetKeyEventNativeData
            (pIVar9,key,(event->window).data2,(event->display).data1,(event->display).data1);
  return true;
}

Assistant:

bool ImGui_ImplSDL2_ProcessEvent(const SDL_Event* event)
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    IM_ASSERT(bd != nullptr && "Context or backend not initialized! Did you call ImGui_ImplSDL2_Init()?");
    ImGuiIO& io = ImGui::GetIO();

    switch (event->type)
    {
        case SDL_MOUSEMOTION:
        {
            ImVec2 mouse_pos((float)event->motion.x, (float)event->motion.y);
            io.AddMouseSourceEvent(event->motion.which == SDL_TOUCH_MOUSEID ? ImGuiMouseSource_TouchScreen : ImGuiMouseSource_Mouse);
            io.AddMousePosEvent(mouse_pos.x, mouse_pos.y);
            return true;
        }
        case SDL_MOUSEWHEEL:
        {
            //IMGUI_DEBUG_LOG("wheel %.2f %.2f, precise %.2f %.2f\n", (float)event->wheel.x, (float)event->wheel.y, event->wheel.preciseX, event->wheel.preciseY);
#if SDL_VERSION_ATLEAST(2,0,18) // If this fails to compile on Emscripten: update to latest Emscripten!
            float wheel_x = -event->wheel.preciseX;
            float wheel_y = event->wheel.preciseY;
#else
            float wheel_x = -(float)event->wheel.x;
            float wheel_y = (float)event->wheel.y;
#endif
#ifdef __EMSCRIPTEN__
            wheel_x /= 100.0f;
#endif
            io.AddMouseSourceEvent(event->wheel.which == SDL_TOUCH_MOUSEID ? ImGuiMouseSource_TouchScreen : ImGuiMouseSource_Mouse);
            io.AddMouseWheelEvent(wheel_x, wheel_y);
            return true;
        }
        case SDL_MOUSEBUTTONDOWN:
        case SDL_MOUSEBUTTONUP:
        {
            int mouse_button = -1;
            if (event->button.button == SDL_BUTTON_LEFT) { mouse_button = 0; }
            if (event->button.button == SDL_BUTTON_RIGHT) { mouse_button = 1; }
            if (event->button.button == SDL_BUTTON_MIDDLE) { mouse_button = 2; }
            if (event->button.button == SDL_BUTTON_X1) { mouse_button = 3; }
            if (event->button.button == SDL_BUTTON_X2) { mouse_button = 4; }
            if (mouse_button == -1)
                break;
            io.AddMouseSourceEvent(event->button.which == SDL_TOUCH_MOUSEID ? ImGuiMouseSource_TouchScreen : ImGuiMouseSource_Mouse);
            io.AddMouseButtonEvent(mouse_button, (event->type == SDL_MOUSEBUTTONDOWN));
            bd->MouseButtonsDown = (event->type == SDL_MOUSEBUTTONDOWN) ? (bd->MouseButtonsDown | (1 << mouse_button)) : (bd->MouseButtonsDown & ~(1 << mouse_button));
            return true;
        }
        case SDL_TEXTINPUT:
        {
            io.AddInputCharactersUTF8(event->text.text);
            return true;
        }
        case SDL_KEYDOWN:
        case SDL_KEYUP:
        {
            ImGui_ImplSDL2_UpdateKeyModifiers((SDL_Keymod)event->key.keysym.mod);
            ImGuiKey key = ImGui_ImplSDL2_KeyEventToImGuiKey(event->key.keysym.sym, event->key.keysym.scancode);
            io.AddKeyEvent(key, (event->type == SDL_KEYDOWN));
            io.SetKeyEventNativeData(key, event->key.keysym.sym, event->key.keysym.scancode, event->key.keysym.scancode); // To support legacy indexing (<1.87 user code). Legacy backend uses SDLK_*** as indices to IsKeyXXX() functions.
            return true;
        }
        case SDL_WINDOWEVENT:
        {
            // - When capturing mouse, SDL will send a bunch of conflicting LEAVE/ENTER event on every mouse move, but the final ENTER tends to be right.
            // - However we won't get a correct LEAVE event for a captured window.
            // - In some cases, when detaching a window from main viewport SDL may send SDL_WINDOWEVENT_ENTER one frame too late,
            //   causing SDL_WINDOWEVENT_LEAVE on previous frame to interrupt drag operation by clear mouse position. This is why
            //   we delay process the SDL_WINDOWEVENT_LEAVE events by one frame. See issue #5012 for details.
            Uint8 window_event = event->window.event;
            if (window_event == SDL_WINDOWEVENT_ENTER)
            {
                bd->MouseWindowID = event->window.windowID;
                bd->MouseLastLeaveFrame = 0;
            }
            if (window_event == SDL_WINDOWEVENT_LEAVE)
                bd->MouseLastLeaveFrame = ImGui::GetFrameCount() + 1;
            if (window_event == SDL_WINDOWEVENT_FOCUS_GAINED)
                io.AddFocusEvent(true);
            else if (event->window.event == SDL_WINDOWEVENT_FOCUS_LOST)
                io.AddFocusEvent(false);
            return true;
        }
        case SDL_CONTROLLERDEVICEADDED:
        case SDL_CONTROLLERDEVICEREMOVED:
        {
            bd->WantUpdateGamepadsList = true;
            return true;
        }
    }
    return false;
}